

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndn-lite-sec-utils.c
# Opt level: O2

int ndn_asn1_encode_ecdsa_signature
              (uint8_t *sig_buf,uint32_t raw_ecdsa_sig_len,uint32_t sig_buf_len)

{
  int iVar1;
  int iVar2;
  uint8_t local_68 [8];
  uint8_t sig [72];
  
  iVar1 = -0x84;
  if (raw_ecdsa_sig_len == 0x40) {
    sig._0_8_ = *(undefined8 *)sig_buf;
    sig._8_8_ = *(undefined8 *)(sig_buf + 8);
    sig._16_8_ = *(undefined8 *)(sig_buf + 0x10);
    sig._24_8_ = *(undefined8 *)(sig_buf + 0x18);
    sig._32_8_ = *(undefined8 *)(sig_buf + 0x20);
    sig._40_8_ = *(undefined8 *)(sig_buf + 0x28);
    sig._48_8_ = *(undefined8 *)(sig_buf + 0x30);
    sig._56_8_ = *(undefined8 *)(sig_buf + 0x38);
    iVar2 = encodeSignatureBits(local_68);
    iVar1 = -0x85;
    if (iVar2 <= (int)sig_buf_len) {
      memcpy(sig_buf,local_68,(long)iVar2);
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

int
ndn_asn1_encode_ecdsa_signature(uint8_t* sig_buf, uint32_t raw_ecdsa_sig_len,
                                uint32_t sig_buf_len)
{
  if (raw_ecdsa_sig_len != 64) {
    return NDN_ASN1_ECDSA_SIG_INVALID_SIZE;
  }
  uint8_t sig[72];
  memcpy(&sig[8], sig_buf, 64);
  int sigLen = encodeSignatureBits(sig);
  if (sigLen > (int)sig_buf_len) {
    return NDN_ASN1_ECDSA_SIG_BUFFER_TOO_SMALL;
  }
  memcpy(sig_buf, sig, sigLen);
  return NDN_SUCCESS;
}